

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

from_chars_result
absl::lts_20250127::anon_unknown_0::FromCharsImpl<float>
          (Nonnull<const_char_*> first,Nonnull<const_char_*> last,float *value,
          chars_format fmt_flags)

{
  float fVar1;
  bool negative_00;
  bool bVar2;
  chars_format cVar3;
  CalculatedFloat CVar4;
  from_chars_result fVar5;
  undefined1 local_120 [8];
  CalculatedFloat calculated_2;
  ParsedFloat decimal_parse;
  undefined1 local_d0 [8];
  CalculatedFloat calculated_1;
  ParsedFloat hex_parse_1;
  undefined1 local_80 [8];
  CalculatedFloat calculated;
  ParsedFloat hex_parse;
  char *hex_first;
  bool negative;
  chars_format fmt_flags_local;
  float *value_local;
  Nonnull<const_char_*> last_local;
  Nonnull<const_char_*> first_local;
  from_chars_result result;
  
  result.ptr._0_4_ = 0;
  negative_00 = false;
  last_local = first;
  if ((first != last) && (*first == '-')) {
    last_local = first + 1;
    negative_00 = true;
  }
  first_local = first;
  cVar3 = operator&(fmt_flags,hex);
  if ((((cVar3 == 0) && (1 < (long)last - (long)last_local)) && (*last_local == '0')) &&
     ((last_local[1] == 'x' || (last_local[1] == 'X')))) {
    strings_internal::ParseFloat<16>
              ((ParsedFloat *)&calculated.exponent,last_local + 2,last,fmt_flags);
    if ((hex_parse.subrange_end == (char *)0x0) || (hex_parse.exponent != 0)) {
      if (fmt_flags == scientific) {
        result.ptr._0_4_ = 0x16;
      }
      else {
        first_local = last_local + 1;
        fVar1 = -0.0;
        if (!negative_00) {
          fVar1 = 0.0;
        }
        *value = fVar1;
      }
    }
    else {
      first_local = hex_parse.subrange_end;
      bVar2 = HandleEdgeCase<float>((ParsedFloat *)&calculated.exponent,negative_00,value);
      if (!bVar2) {
        CVar4 = CalculateFromParsedHexadecimal<float>((ParsedFloat *)&calculated.exponent);
        local_80 = (undefined1  [8])CVar4.mantissa;
        calculated.mantissa._0_4_ = CVar4.exponent;
        EncodeResult<float>((CalculatedFloat *)local_80,negative_00,
                            (Nonnull<absl::from_chars_result_*>)&first_local,value);
      }
    }
  }
  else {
    cVar3 = operator&(fmt_flags,hex);
    if (cVar3 == hex) {
      strings_internal::ParseFloat<16>
                ((ParsedFloat *)&calculated_1.exponent,last_local,last,fmt_flags);
      if (hex_parse_1.subrange_end == (char *)0x0) {
        result.ptr._0_4_ = 0x16;
      }
      else {
        first_local = hex_parse_1.subrange_end;
        bVar2 = HandleEdgeCase<float>((ParsedFloat *)&calculated_1.exponent,negative_00,value);
        if (!bVar2) {
          CVar4 = CalculateFromParsedHexadecimal<float>((ParsedFloat *)&calculated_1.exponent);
          local_d0 = (undefined1  [8])CVar4.mantissa;
          calculated_1.mantissa._0_4_ = CVar4.exponent;
          EncodeResult<float>((CalculatedFloat *)local_d0,negative_00,
                              (Nonnull<absl::from_chars_result_*>)&first_local,value);
        }
      }
    }
    else {
      strings_internal::ParseFloat<10>
                ((ParsedFloat *)&calculated_2.exponent,last_local,last,fmt_flags);
      if (decimal_parse.subrange_end == (char *)0x0) {
        result.ptr._0_4_ = 0x16;
      }
      else {
        first_local = decimal_parse.subrange_end;
        bVar2 = HandleEdgeCase<float>((ParsedFloat *)&calculated_2.exponent,negative_00,value);
        if ((!bVar2) &&
           ((decimal_parse._16_8_ != 0 ||
            (bVar2 = EiselLemire<float>((ParsedFloat *)&calculated_2.exponent,negative_00,value,
                                        (Nonnull<std::errc_*>)&result), !bVar2)))) {
          CVar4 = CalculateFromParsedDecimal<float>((ParsedFloat *)&calculated_2.exponent);
          local_120 = (undefined1  [8])CVar4.mantissa;
          calculated_2.mantissa._0_4_ = CVar4.exponent;
          EncodeResult<float>((CalculatedFloat *)local_120,negative_00,
                              (Nonnull<absl::from_chars_result_*>)&first_local,value);
        }
      }
    }
  }
  fVar5.ec = result.ptr._0_4_;
  fVar5.ptr = first_local;
  fVar5._12_4_ = 0;
  return fVar5;
}

Assistant:

from_chars_result FromCharsImpl(absl::Nonnull<const char*> first,
                                absl::Nonnull<const char*> last,
                                FloatType& value, chars_format fmt_flags) {
  from_chars_result result;
  result.ptr = first;  // overwritten on successful parse
  result.ec = std::errc();

  bool negative = false;
  if (first != last && *first == '-') {
    ++first;
    negative = true;
  }
  // If the `hex` flag is *not* set, then we will accept a 0x prefix and try
  // to parse a hexadecimal float.
  if ((fmt_flags & chars_format::hex) == chars_format{} && last - first >= 2 &&
      *first == '0' && (first[1] == 'x' || first[1] == 'X')) {
    const char* hex_first = first + 2;
    strings_internal::ParsedFloat hex_parse =
        strings_internal::ParseFloat<16>(hex_first, last, fmt_flags);
    if (hex_parse.end == nullptr ||
        hex_parse.type != strings_internal::FloatType::kNumber) {
      // Either we failed to parse a hex float after the "0x", or we read
      // "0xinf" or "0xnan" which we don't want to match.
      //
      // However, a string that begins with "0x" also begins with "0", which
      // is normally a valid match for the number zero.  So we want these
      // strings to match zero unless fmt_flags is `scientific`.  (This flag
      // means an exponent is required, which the string "0" does not have.)
      if (fmt_flags == chars_format::scientific) {
        result.ec = std::errc::invalid_argument;
      } else {
        result.ptr = first + 1;
        value = negative ? -0.0 : 0.0;
      }
      return result;
    }
    // We matched a value.
    result.ptr = hex_parse.end;
    if (HandleEdgeCase(hex_parse, negative, &value)) {
      return result;
    }
    CalculatedFloat calculated =
        CalculateFromParsedHexadecimal<FloatType>(hex_parse);
    EncodeResult(calculated, negative, &result, &value);
    return result;
  }
  // Otherwise, we choose the number base based on the flags.
  if ((fmt_flags & chars_format::hex) == chars_format::hex) {
    strings_internal::ParsedFloat hex_parse =
        strings_internal::ParseFloat<16>(first, last, fmt_flags);
    if (hex_parse.end == nullptr) {
      result.ec = std::errc::invalid_argument;
      return result;
    }
    result.ptr = hex_parse.end;
    if (HandleEdgeCase(hex_parse, negative, &value)) {
      return result;
    }
    CalculatedFloat calculated =
        CalculateFromParsedHexadecimal<FloatType>(hex_parse);
    EncodeResult(calculated, negative, &result, &value);
    return result;
  } else {
    strings_internal::ParsedFloat decimal_parse =
        strings_internal::ParseFloat<10>(first, last, fmt_flags);
    if (decimal_parse.end == nullptr) {
      result.ec = std::errc::invalid_argument;
      return result;
    }
    result.ptr = decimal_parse.end;
    if (HandleEdgeCase(decimal_parse, negative, &value)) {
      return result;
    }
    // A nullptr subrange_begin means that the decimal_parse.mantissa is exact
    // (not truncated), a precondition of the Eisel-Lemire algorithm.
    if ((decimal_parse.subrange_begin == nullptr) &&
        EiselLemire<FloatType>(decimal_parse, negative, &value, &result.ec)) {
      return result;
    }
    CalculatedFloat calculated =
        CalculateFromParsedDecimal<FloatType>(decimal_parse);
    EncodeResult(calculated, negative, &result, &value);
    return result;
  }
}